

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool __thiscall EOPlus::Context::TriggerRule(Context *this,string *rule)

{
  bool bVar1;
  anon_class_1_0_00000001 local_59;
  function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)> local_58;
  string local_38;
  string *local_18;
  string *rule_local;
  Context *this_local;
  
  local_18 = rule;
  rule_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)rule);
  std::function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)>::
  function<EOPlus::Context::TriggerRule(std::__cxx11::string)::__0,void>
            ((function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)> *)
             &local_58,&local_59);
  bVar1 = TriggerRule(this,&local_38,&local_58);
  std::function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>::~function
            (&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool Context::TriggerRule(std::string rule)
	{
		return this->TriggerRule(rule, [](const std::deque<util::variant>&) { return true; });
	}